

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreevent.h
# Opt level: O3

void __thiscall PressDelayHandler::timerEvent(PressDelayHandler *this,QTimerEvent *e)

{
  Data *pDVar1;
  QMouseEvent *me;
  
  if (*(TimerId *)(e + 0x10) != (this->pressDelayTimer).m_id) {
    return;
  }
  me = (this->pressDelayEvent).d;
  if (me != (QMouseEvent *)0x0) {
    pDVar1 = (this->mouseTarget).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       ((this->mouseTarget).wp.value != (QObject *)0x0)) {
      sendMouseEvent(this,me,1);
      me = (this->pressDelayEvent).d;
      if (me == (QMouseEvent *)0x0) goto LAB_00651a68;
    }
    (this->pressDelayEvent).d = (QMouseEvent *)0x0;
    (**(code **)(*(long *)me + 8))(me);
  }
LAB_00651a68:
  if ((this->pressDelayTimer).m_id == Invalid) {
    return;
  }
  QBasicTimer::stop();
  return;
}

Assistant:

Qt::TimerId id() const { return m_id; }